

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O1

Aig_Man_t * Abc_NtkToDar(Abc_Ntk_t *pNtk,int fExors,int fRegisters)

{
  ulong *puVar1;
  byte *pbVar2;
  void *pvVar3;
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 aVar4;
  long *plVar5;
  int iVar6;
  long lVar7;
  Aig_Man_t *p;
  char *pcVar8;
  Abc_Obj_t *pAVar9;
  Aig_Obj_t *pAVar10;
  Vec_Ptr_t *pVVar11;
  Vec_Int_t *pVVar12;
  int *piVar13;
  Vec_Ptr_t *pVVar14;
  void **__ptr;
  void *__dest;
  int iVar15;
  long lVar16;
  ulong uVar17;
  uint uVar18;
  int level;
  Aig_Man_t *pAVar20;
  uint uVar21;
  Abc_Ntk_t *pAVar19;
  
  if (fRegisters != 0) {
    if (pNtk->vBoxes->nSize != pNtk->nObjCounts[8]) {
      __assert_fail("Abc_NtkBoxNum(pNtk) == Abc_NtkLatchNum(pNtk)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                    ,0xf3,"Aig_Man_t *Abc_NtkToDar(Abc_Ntk_t *, int, int)");
    }
    lVar7 = (long)pNtk->vCis->nSize;
    pAVar19 = pNtk;
    if (0 < lVar7) {
      lVar16 = 0;
      do {
        uVar18 = *(uint *)((long)pNtk->vCis->pArray[lVar16] + 0x14) & 0xf;
        pAVar19 = (Abc_Ntk_t *)(ulong)uVar18;
        if (lVar16 < pNtk->vPis->nSize) {
          if (uVar18 != 2) {
            __assert_fail("Abc_ObjIsPi(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                          ,0xf7,"Aig_Man_t *Abc_NtkToDar(Abc_Ntk_t *, int, int)");
          }
        }
        else if (uVar18 != 5) {
          __assert_fail("Abc_ObjIsBo(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                        ,0xfc,"Aig_Man_t *Abc_NtkToDar(Abc_Ntk_t *, int, int)");
        }
        lVar16 = lVar16 + 1;
      } while (lVar7 != lVar16);
    }
    uVar18 = (uint)pAVar19;
    lVar7 = (long)pNtk->vCos->nSize;
    if (0 < lVar7) {
      lVar16 = 0;
      do {
        uVar18 = *(uint *)((long)pNtk->vCos->pArray[lVar16] + 0x14) & 0xf;
        if (lVar16 < pNtk->vPos->nSize) {
          if (uVar18 != 3) {
            __assert_fail("Abc_ObjIsPo(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                          ,0x100,"Aig_Man_t *Abc_NtkToDar(Abc_Ntk_t *, int, int)");
          }
        }
        else if (uVar18 != 4) {
          __assert_fail("Abc_ObjIsBi(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                        ,0x105,"Aig_Man_t *Abc_NtkToDar(Abc_Ntk_t *, int, int)");
        }
        lVar16 = lVar16 + 1;
      } while (lVar7 != lVar16);
    }
    pVVar11 = pNtk->vBoxes;
    if (pVVar11->nSize < 1) {
      iVar15 = 0;
    }
    else {
      lVar7 = 0;
      iVar15 = 0;
      do {
        pvVar3 = pVVar11->pArray[lVar7];
        if (((*(uint *)((long)pvVar3 + 0x14) & 0xf) == 8) && (*(long *)((long)pvVar3 + 0x38) == 3))
        {
          *(undefined8 *)((long)pvVar3 + 0x38) = 1;
          iVar15 = iVar15 + 1;
        }
        lVar7 = lVar7 + 1;
        pVVar11 = pNtk->vBoxes;
      } while (lVar7 < pVVar11->nSize);
    }
    if (iVar15 != 0) {
      Abc_Print(uVar18,"Warning: %d registers in this network have don\'t-care init values.\n");
      Abc_Print(uVar18,"The don\'t-care are assumed to be 0. The result may not verify.\n");
      Abc_Print(uVar18,"Use command \"print_latch\" to see the init values of registers.\n");
      Abc_Print(uVar18,"Use command \"zero\" to convert or \"init\" to change the values.\n");
    }
  }
  p = Aig_ManStart(pNtk->nObjCounts[7] + 100);
  p->fCatchExor = fExors;
  p->nConstrs = pNtk->nConstrs;
  p->nBarBufs = pNtk->nBarBufs;
  pcVar8 = Extra_UtilStrsav(pNtk->pName);
  p->pName = pcVar8;
  pcVar8 = Extra_UtilStrsav(pNtk->pSpec);
  p->pSpec = pcVar8;
  aVar4 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)p->pConst1;
  pAVar9 = Abc_AigConst1(pNtk);
  pAVar9->field_6 = aVar4;
  pVVar11 = pNtk->vCis;
  if (0 < pVVar11->nSize) {
    lVar7 = 0;
    do {
      pvVar3 = pVVar11->pArray[lVar7];
      pAVar10 = Aig_ObjCreateCi(p);
      *(Aig_Obj_t **)((long)pvVar3 + 0x40) = pAVar10;
      *(ulong *)&pAVar10->field_0x18 =
           *(ulong *)&pAVar10->field_0x18 & 0xff000000ffffffff |
           (ulong)(*(uint *)((long)pvVar3 + 0x14) >> 0xc) << 0x20;
      lVar7 = lVar7 + 1;
      pVVar11 = pNtk->vCis;
    } while (lVar7 < pVVar11->nSize);
  }
  if ((fRegisters != 0) && (pVVar11 = pNtk->vBoxes, 0 < pVVar11->nSize)) {
    lVar7 = 0;
    do {
      plVar5 = (long *)pVVar11->pArray[lVar7];
      if (((*(uint *)((long)plVar5 + 0x14) & 0xf) == 8) && (plVar5[7] == 2)) {
        puVar1 = (ulong *)(*(long *)(*(long *)(*(long *)(*plVar5 + 0x20) + 8) +
                                    (long)*(int *)plVar5[6] * 8) + 0x40);
        *puVar1 = *puVar1 ^ 1;
      }
      lVar7 = lVar7 + 1;
      pVVar11 = pNtk->vBoxes;
    } while (lVar7 < pVVar11->nSize);
  }
  pVVar11 = Abc_NtkDfs(pNtk,0);
  if (0 < pVVar11->nSize) {
    lVar7 = 0;
    do {
      plVar5 = (long *)pVVar11->pArray[lVar7];
      lVar16 = *(long *)(*(long *)(*plVar5 + 0x20) + 8);
      pAVar10 = Aig_And(p,(Aig_Obj_t *)
                          ((ulong)(*(uint *)((long)plVar5 + 0x14) >> 10 & 1) ^
                          *(ulong *)(*(long *)(lVar16 + (long)*(int *)plVar5[4] * 8) + 0x40)),
                        (Aig_Obj_t *)
                        ((ulong)(*(uint *)((long)plVar5 + 0x14) >> 0xb & 1) ^
                        *(ulong *)(*(long *)(lVar16 + (long)((int *)plVar5[4])[1] * 8) + 0x40)));
      plVar5[8] = (long)pAVar10;
      lVar7 = lVar7 + 1;
    } while (lVar7 < pVVar11->nSize);
  }
  if (pVVar11->pArray != (void **)0x0) {
    free(pVVar11->pArray);
    pVVar11->pArray = (void **)0x0;
  }
  if (pVVar11 != (Vec_Ptr_t *)0x0) {
    free(pVVar11);
  }
  p->fAddStrash = 0;
  pVVar11 = pNtk->vCos;
  if (0 < pVVar11->nSize) {
    lVar7 = 0;
    do {
      plVar5 = (long *)pVVar11->pArray[lVar7];
      Aig_ObjCreateCo(p,(Aig_Obj_t *)
                        ((ulong)(*(uint *)((long)plVar5 + 0x14) >> 10 & 1) ^
                        *(ulong *)(*(long *)(*(long *)(*(long *)(*plVar5 + 0x20) + 8) +
                                            (long)*(int *)plVar5[4] * 8) + 0x40)));
      lVar7 = lVar7 + 1;
      pVVar11 = pNtk->vCos;
    } while (lVar7 < pVVar11->nSize);
  }
  Aig_ManSetRegNum(p,pNtk->nObjCounts[8]);
  if (fRegisters != 0) {
    uVar18 = p->nObjs[3] - p->nRegs;
    pVVar11 = p->vCos;
    iVar15 = pVVar11->nSize;
    if ((int)uVar18 < iVar15) {
      uVar17 = (ulong)uVar18;
      do {
        if (((int)uVar18 < 0) || (pNtk->vCos->nSize <= (int)uVar17)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        plVar5 = (long *)pNtk->vCos->pArray[uVar17];
        lVar7 = *(long *)(*(long *)(*(long *)(*plVar5 + 0x20) + 8) + (long)*(int *)plVar5[6] * 8);
        if ((*(uint *)(lVar7 + 0x14) & 0xf) != 8) {
          __assert_fail("Abc_ObjIsLatch(pLatch)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                        ,0x1a9,"int Abc_LatchIsInit1(Abc_Obj_t *)");
        }
        if (*(long *)(lVar7 + 0x38) == 2) {
          pbVar2 = (byte *)((long)pVVar11->pArray[uVar17] + 8);
          *pbVar2 = *pbVar2 ^ 1;
        }
        uVar17 = uVar17 + 1;
      } while ((int)uVar17 < iVar15);
    }
  }
  pAVar19 = pNtk;
  iVar15 = Abc_NtkGetChoiceNum(pNtk);
  level = (int)pAVar19;
  iVar6 = 0;
  if (iVar15 == 0) {
    pAVar20 = p;
    iVar6 = Aig_ManCleanup(p);
    level = (int)pAVar20;
  }
  if ((fExors == 0) && (iVar6 != 0)) {
    Abc_Print(level,"Abc_NtkToDar(): Unexpected %d dangling nodes when converting to AIG!\n");
  }
  if (fRegisters != 0) {
    Aig_ManSetRegNum(p,pNtk->nObjCounts[8]);
    uVar18 = p->nRegs;
    pVVar12 = (Vec_Int_t *)malloc(0x10);
    uVar21 = 0x10;
    if (0xe < uVar18 - 1) {
      uVar21 = uVar18;
    }
    pVVar12->nSize = 0;
    pVVar12->nCap = uVar21;
    if (uVar21 == 0) {
      piVar13 = (int *)0x0;
    }
    else {
      piVar13 = (int *)malloc((long)(int)uVar21 << 2);
    }
    pVVar12->pArray = piVar13;
    pVVar12->nSize = uVar18;
    if (0 < (int)uVar18) {
      uVar17 = 0;
      do {
        piVar13[uVar17] = (int)uVar17;
        uVar17 = uVar17 + 1;
      } while (uVar18 != uVar17);
    }
    p->vFlopNums = pVVar12;
    pVVar11 = pNtk->vOnehots;
    if (pVVar11 != (Vec_Ptr_t *)0x0) {
      uVar18 = pVVar11->nSize;
      pVVar14 = (Vec_Ptr_t *)malloc(0x10);
      uVar21 = 8;
      if (6 < uVar18 - 1) {
        uVar21 = uVar18;
      }
      pVVar14->nSize = 0;
      pVVar14->nCap = uVar21;
      if (uVar21 == 0) {
        __ptr = (void **)0x0;
      }
      else {
        __ptr = (void **)malloc((long)(int)uVar21 << 3);
      }
      pVVar14->pArray = __ptr;
      if (0 < (int)uVar18) {
        lVar7 = 0;
        do {
          pvVar3 = pVVar11->pArray[lVar7];
          piVar13 = (int *)malloc(0x10);
          iVar15 = *(int *)((long)pvVar3 + 4);
          lVar16 = (long)iVar15;
          piVar13[1] = iVar15;
          *piVar13 = iVar15;
          if (lVar16 == 0) {
            __dest = (void *)0x0;
          }
          else {
            __dest = malloc(lVar16 * 4);
          }
          *(void **)(piVar13 + 2) = __dest;
          memcpy(__dest,*(void **)((long)pvVar3 + 8),lVar16 << 2);
          if ((uint)lVar7 == uVar21) {
            if ((int)uVar21 < 0x10) {
              if (__ptr == (void **)0x0) {
                __ptr = (void **)malloc(0x80);
              }
              else {
                __ptr = (void **)realloc(__ptr,0x80);
              }
              uVar21 = 0x10;
            }
            else {
              uVar18 = uVar21 * 2;
              if (SBORROW4(uVar21,uVar18) != 0 < (int)uVar21) {
                uVar21 = uVar18;
                if (__ptr == (void **)0x0) {
                  __ptr = (void **)malloc((ulong)uVar18 << 3);
                }
                else {
                  __ptr = (void **)realloc(__ptr,(ulong)uVar18 << 3);
                }
              }
            }
          }
          __ptr[lVar7] = piVar13;
          lVar7 = lVar7 + 1;
        } while (lVar7 < pVVar11->nSize);
        pVVar14->nSize = (int)lVar7;
        pVVar14->nCap = uVar21;
        pVVar14->pArray = __ptr;
      }
      p->vOnehots = pVVar14;
    }
  }
  pAVar20 = p;
  iVar15 = Aig_ManCheck(p);
  if (iVar15 == 0) {
    Abc_Print((int)pAVar20,"Abc_NtkToDar: AIG check has failed.\n");
    Aig_ManStop(p);
    p = (Aig_Man_t *)0x0;
  }
  return p;
}

Assistant:

Aig_Man_t * Abc_NtkToDar( Abc_Ntk_t * pNtk, int fExors, int fRegisters )
{
    Vec_Ptr_t * vNodes;
    Aig_Man_t * pMan;
    Aig_Obj_t * pObjNew;
    Abc_Obj_t * pObj;
    int i, nNodes, nDontCares;
    // make sure the latches follow PIs/POs
    if ( fRegisters ) 
    { 
        assert( Abc_NtkBoxNum(pNtk) == Abc_NtkLatchNum(pNtk) );
        Abc_NtkForEachCi( pNtk, pObj, i )
            if ( i < Abc_NtkPiNum(pNtk) )
            {
                assert( Abc_ObjIsPi(pObj) );
                if ( !Abc_ObjIsPi(pObj) )
                    Abc_Print( 1, "Abc_NtkToDar(): Temporary bug: The PI ordering is wrong!\n" );
            }
            else
                assert( Abc_ObjIsBo(pObj) );
        Abc_NtkForEachCo( pNtk, pObj, i )
            if ( i < Abc_NtkPoNum(pNtk) )
            {
                assert( Abc_ObjIsPo(pObj) );
                if ( !Abc_ObjIsPo(pObj) )
                    Abc_Print( 1, "Abc_NtkToDar(): Temporary bug: The PO ordering is wrong!\n" );
            }
            else
                assert( Abc_ObjIsBi(pObj) );
        // print warning about initial values
        nDontCares = 0;
        Abc_NtkForEachLatch( pNtk, pObj, i )
            if ( Abc_LatchIsInitDc(pObj) )
            {
                Abc_LatchSetInit0(pObj);
                nDontCares++;
            }
        if ( nDontCares )
        {
            Abc_Print( 1, "Warning: %d registers in this network have don't-care init values.\n", nDontCares );
            Abc_Print( 1, "The don't-care are assumed to be 0. The result may not verify.\n" );
            Abc_Print( 1, "Use command \"print_latch\" to see the init values of registers.\n" );
            Abc_Print( 1, "Use command \"zero\" to convert or \"init\" to change the values.\n" );
        }
    }
    // create the manager
    pMan = Aig_ManStart( Abc_NtkNodeNum(pNtk) + 100 );
    pMan->fCatchExor = fExors;
    pMan->nConstrs = pNtk->nConstrs;
    pMan->nBarBufs = pNtk->nBarBufs;
    pMan->pName = Extra_UtilStrsav( pNtk->pName );
    pMan->pSpec = Extra_UtilStrsav( pNtk->pSpec );
    // transfer the pointers to the basic nodes
    Abc_AigConst1(pNtk)->pCopy = (Abc_Obj_t *)Aig_ManConst1(pMan);
    Abc_NtkForEachCi( pNtk, pObj, i )
    {
        pObj->pCopy = (Abc_Obj_t *)Aig_ObjCreateCi(pMan);
        // initialize logic level of the CIs
        ((Aig_Obj_t *)pObj->pCopy)->Level = pObj->Level;
    }

    // complement the 1-values registers
    if ( fRegisters ) {
        Abc_NtkForEachLatch( pNtk, pObj, i )
            if ( Abc_LatchIsInit1(pObj) )
                Abc_ObjFanout0(pObj)->pCopy = Abc_ObjNot(Abc_ObjFanout0(pObj)->pCopy);
    }
    // perform the conversion of the internal nodes (assumes DFS ordering)
//    pMan->fAddStrash = 1;
    vNodes = Abc_NtkDfs( pNtk, 0 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
//    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        pObj->pCopy = (Abc_Obj_t *)Aig_And( pMan, (Aig_Obj_t *)Abc_ObjChild0Copy(pObj), (Aig_Obj_t *)Abc_ObjChild1Copy(pObj) );
//        Abc_Print( 1, "%d->%d ", pObj->Id, ((Aig_Obj_t *)pObj->pCopy)->Id );
    }
    Vec_PtrFree( vNodes );
    pMan->fAddStrash = 0;
    // create the POs
    Abc_NtkForEachCo( pNtk, pObj, i )
        Aig_ObjCreateCo( pMan, (Aig_Obj_t *)Abc_ObjChild0Copy(pObj) );
    // complement the 1-valued registers
    Aig_ManSetRegNum( pMan, Abc_NtkLatchNum(pNtk) );
    if ( fRegisters )
        Aig_ManForEachLiSeq( pMan, pObjNew, i )
            if ( Abc_LatchIsInit1(Abc_ObjFanout0(Abc_NtkCo(pNtk,i))) )
                pObjNew->pFanin0 = Aig_Not(pObjNew->pFanin0);
    // remove dangling nodes
    nNodes = (Abc_NtkGetChoiceNum(pNtk) == 0)? Aig_ManCleanup( pMan ) : 0;
    if ( !fExors && nNodes )
        Abc_Print( 1, "Abc_NtkToDar(): Unexpected %d dangling nodes when converting to AIG!\n", nNodes );
//Aig_ManDumpVerilog( pMan, "test.v" );
    // save the number of registers
    if ( fRegisters )
    {
        Aig_ManSetRegNum( pMan, Abc_NtkLatchNum(pNtk) );
        pMan->vFlopNums = Vec_IntStartNatural( pMan->nRegs );
//        pMan->vFlopNums = NULL;
//        pMan->vOnehots = Abc_NtkConverLatchNamesIntoNumbers( pNtk );
        if ( pNtk->vOnehots )
            pMan->vOnehots = (Vec_Ptr_t *)Vec_VecDupInt( (Vec_Vec_t *)pNtk->vOnehots );
    }
    if ( !Aig_ManCheck( pMan ) )
    {
        Abc_Print( 1, "Abc_NtkToDar: AIG check has failed.\n" );
        Aig_ManStop( pMan );
        return NULL;
    }
    return pMan;
}